

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::binary_escape_string(string *__return_storage_ptr__,string *string_to_escape)

{
  byte __c;
  size_type sVar1;
  size_t __n;
  size_t __n_00;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  void *pvVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *__s;
  size_type sVar8;
  pointer pcVar9;
  string code;
  stringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  size_type *local_220;
  size_type local_218;
  size_type local_210;
  undefined8 uStack_208;
  long *local_200;
  ulong local_1f8;
  long local_1f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = string_to_escape->_M_string_length;
  if (sVar1 == 0) {
    return __return_storage_ptr__;
  }
  pcVar9 = (string_to_escape->_M_dataplus)._M_p;
  sVar8 = 0;
  local_1c0 = string_to_escape;
  do {
    __c = pcVar9[sVar8];
    iVar2 = isprint((uint)__c);
    if (iVar2 == 0) {
      ::std::__cxx11::stringstream::stringstream(local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__cxx11::stringbuf::str();
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"\\x","");
      __s = "";
      if (local_1f8 < 2) {
        __s = "0";
      }
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1e0,__s);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar3->_M_dataplus)._M_p;
      paVar6 = &pbVar3->field_2;
      if (paVar7 == paVar6) {
        local_240.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_240.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      }
      else {
        local_240.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_240._M_dataplus._M_p = (pointer)paVar7;
      }
      local_240._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_240,(char *)local_200,local_1f8);
      local_220 = (size_type *)(pbVar3->_M_dataplus)._M_p;
      paVar7 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220 == paVar7) {
        local_210 = paVar7->_M_allocated_capacity;
        uStack_208 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_220 = &local_210;
      }
      else {
        local_210 = paVar7->_M_allocated_capacity;
      }
      local_218 = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(char *)local_220,local_218);
      if (local_220 != &local_210) {
        operator_delete(local_220,local_210 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      ::std::__cxx11::stringstream::~stringstream(local_1b8);
      ::std::ios_base::~ios_base(local_138);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
    sVar8 = sVar8 + 1;
  } while (sVar1 != sVar8);
  __n = __return_storage_ptr__->_M_string_length;
  __n_00 = local_1c0->_M_string_length;
  if (__n == __n_00) {
    if (__n_00 == 0) {
      return __return_storage_ptr__;
    }
    pcVar9 = (__return_storage_ptr__->_M_dataplus)._M_p;
    iVar2 = bcmp(pcVar9,(local_1c0->_M_dataplus)._M_p,__n_00);
    if (iVar2 == 0) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (__n == 0) goto LAB_001a0916;
    pcVar9 = (__return_storage_ptr__->_M_dataplus)._M_p;
  }
  pvVar4 = memchr(pcVar9,0x27,__n);
  lVar5 = (long)pvVar4 - (long)pcVar9;
  if (lVar5 != -1 && pvVar4 != (void *)0x0) {
    while( true ) {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar5] = '\\';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (__return_storage_ptr__,lVar5 + 1,0,"x27",3);
      if (__return_storage_ptr__->_M_string_length == 0) break;
      pcVar9 = (__return_storage_ptr__->_M_dataplus)._M_p;
      pvVar4 = memchr(pcVar9,0x27,__return_storage_ptr__->_M_string_length);
      if ((pvVar4 == (void *)0x0) || (lVar5 = (long)pvVar4 - (long)pcVar9, lVar5 == -1)) break;
    }
  }
LAB_001a0916:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
            (__return_storage_ptr__,0,0,"\'B\"(",4);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,')');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'\"');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'\'');
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}